

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O0

void __thiscall
capnp::FlatArrayMessageReader::FlatArrayMessageReader
          (FlatArrayMessageReader *this,ArrayPtr<const_capnp::word> array,ReaderOptions options)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  word *pwVar4;
  size_t sVar5;
  ArrayPtr<const_capnp::word> *pAVar6;
  ArrayPtr<const_capnp::word> AVar7;
  ReaderOptions options_00;
  Fault local_178;
  Fault f_2;
  size_t local_168;
  DebugExpression<unsigned_long> local_160;
  undefined1 local_158 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_2;
  uint segmentSize_1;
  uint i;
  ArrayPtr<const_capnp::word> local_110;
  Fault local_100;
  Fault f_1;
  size_t local_f0;
  DebugExpression<unsigned_long> local_e8;
  undefined1 local_e0 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_1;
  uint segmentSize;
  Fault f;
  DebugExpression<unsigned_long> local_a0;
  undefined1 local_98 [8];
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition;
  size_t offset;
  uint segmentCount;
  WireValue<uint32_t> *table;
  FlatArrayMessageReader *this_local;
  ReaderOptions options_local;
  ArrayPtr<const_capnp::word> array_local;
  
  options_local._8_8_ = array.ptr;
  options_local.traversalLimitInWords._0_4_ = options.nestingLimit;
  options_00._12_4_ = 0;
  options_00.traversalLimitInWords = SUB128(options._0_12_,0);
  options_00.nestingLimit = SUB124(options._0_12_,8);
  MessageReader::MessageReader(&this->super_MessageReader,options_00);
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__FlatArrayMessageReader_0039f8b0;
  kj::ArrayPtr<const_capnp::word>::ArrayPtr(&this->segment0);
  kj::Array<kj::ArrayPtr<const_capnp::word>_>::Array(&this->moreSegments);
  pwVar4 = kj::ArrayPtr<const_capnp::word>::end
                     ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit);
  this->end = pwVar4;
  sVar5 = kj::ArrayPtr<const_capnp::word>::size
                    ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit);
  if (sVar5 != 0) {
    pwVar4 = kj::ArrayPtr<const_capnp::word>::begin
                       ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit);
    uVar2 = capnp::_::DirectWireValue<unsigned_int>::get((DirectWireValue<unsigned_int> *)pwVar4);
    uVar3 = uVar2 + 1;
    _kjCondition._32_8_ = ZEXT48((uVar3 >> 1) + 1);
    f.exception = (Exception *)
                  kj::ArrayPtr<const_capnp::word>::size
                            ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit);
    local_a0 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(unsigned_long *)&f);
    kj::_::DebugExpression<unsigned_long>::operator>=
              ((DebugComparison<unsigned_long,_unsigned_long_&> *)local_98,&local_a0,
               (unsigned_long *)&_kjCondition.result);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
    if (bVar1) {
      _kjCondition_1._36_4_ =
           capnp::_::DirectWireValue<unsigned_int>::get
                     ((DirectWireValue<unsigned_int> *)((long)&pwVar4->content + 4));
      local_f0 = kj::ArrayPtr<const_capnp::word>::size
                           ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit);
      local_e8 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_f0);
      f_1.exception = (Exception *)(_kjCondition._32_8_ + (ulong)(uint)_kjCondition_1._36_4_);
      kj::_::DebugExpression<unsigned_long>::operator>=
                ((DebugComparison<unsigned_long,_unsigned_long> *)local_e0,&local_e8,
                 (unsigned_long *)&f_1);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e0);
      if (bVar1) {
        local_110 = kj::ArrayPtr<const_capnp::word>::slice
                              ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit,
                               _kjCondition._32_8_,
                               _kjCondition._32_8_ + (ulong)(uint)_kjCondition_1._36_4_);
        this->segment0 = local_110;
        _kjCondition._32_8_ = (ulong)(uint)_kjCondition_1._36_4_ + _kjCondition._32_8_;
        if (1 < uVar3) {
          kj::heapArray<kj::ArrayPtr<capnp::word_const>>
                    ((Array<kj::ArrayPtr<const_capnp::word>_> *)&segmentSize_1,(kj *)(ulong)uVar2,
                     (size_t)local_110.ptr);
          kj::Array<kj::ArrayPtr<const_capnp::word>_>::operator=
                    (&this->moreSegments,(Array<kj::ArrayPtr<const_capnp::word>_> *)&segmentSize_1);
          kj::Array<kj::ArrayPtr<const_capnp::word>_>::~Array
                    ((Array<kj::ArrayPtr<const_capnp::word>_> *)&segmentSize_1);
          for (_kjCondition_2._36_4_ = 1; (uint)_kjCondition_2._36_4_ < uVar3;
              _kjCondition_2._36_4_ = _kjCondition_2._36_4_ + 1) {
            _kjCondition_2._32_4_ =
                 capnp::_::DirectWireValue<unsigned_int>::get
                           ((DirectWireValue<unsigned_int> *)
                            ((long)&pwVar4->content + (ulong)(_kjCondition_2._36_4_ + 1) * 4));
            local_168 = kj::ArrayPtr<const_capnp::word>::size
                                  ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit);
            local_160 = kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_168);
            f_2.exception = (Exception *)(_kjCondition._32_8_ + (ulong)(uint)_kjCondition_2._32_4_);
            kj::_::DebugExpression<unsigned_long>::operator>=
                      ((DebugComparison<unsigned_long,_unsigned_long> *)local_158,&local_160,
                       (unsigned_long *)&f_2);
            bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_158);
            if (!bVar1) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[26]>
                        (&local_178,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
                         ,0x45,FAILED,"array.size() >= offset + segmentSize",
                         "_kjCondition,\"Message ends prematurely.\"",
                         (DebugComparison<unsigned_long,_unsigned_long> *)local_158,
                         (char (*) [26])"Message ends prematurely.");
              kj::Array<kj::ArrayPtr<const_capnp::word>_>::operator=
                        (&this->moreSegments,(void *)0x0);
              kj::_::Debug::Fault::~Fault(&local_178);
              return;
            }
            AVar7 = kj::ArrayPtr<const_capnp::word>::slice
                              ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit,
                               _kjCondition._32_8_,
                               _kjCondition._32_8_ + (ulong)(uint)_kjCondition_2._32_4_);
            pAVar6 = kj::Array<kj::ArrayPtr<const_capnp::word>_>::operator[]
                               (&this->moreSegments,(ulong)(_kjCondition_2._36_4_ - 1));
            *pAVar6 = AVar7;
            _kjCondition._32_8_ = (ulong)(uint)_kjCondition_2._32_4_ + _kjCondition._32_8_;
          }
        }
        pwVar4 = kj::ArrayPtr<const_capnp::word>::begin
                           ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit);
        this->end = pwVar4 + _kjCondition._32_8_;
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[43]>
                  (&local_100,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
                   ,0x37,FAILED,"array.size() >= offset + segmentSize",
                   "_kjCondition,\"Message ends prematurely in first segment.\"",
                   (DebugComparison<unsigned_long,_unsigned_long> *)local_e0,
                   (char (*) [43])"Message ends prematurely in first segment.");
        kj::_::Debug::Fault::~Fault(&local_100);
      }
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long&>&,char_const(&)[43]>
                ((Fault *)&stack0xffffffffffffff50,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
                 ,0x2f,FAILED,"array.size() >= offset",
                 "_kjCondition,\"Message ends prematurely in segment table.\"",
                 (DebugComparison<unsigned_long,_unsigned_long_&> *)local_98,
                 (char (*) [43])"Message ends prematurely in segment table.");
      kj::_::Debug::Fault::~Fault((Fault *)&stack0xffffffffffffff50);
    }
  }
  return;
}

Assistant:

FlatArrayMessageReader::FlatArrayMessageReader(
    kj::ArrayPtr<const word> array, ReaderOptions options)
    : MessageReader(options), end(array.end()) {
  if (array.size() < 1) {
    // Assume empty message.
    return;
  }

  const _::WireValue<uint32_t>* table =
      reinterpret_cast<const _::WireValue<uint32_t>*>(array.begin());

  uint segmentCount = table[0].get() + 1;
  size_t offset = segmentCount / 2u + 1u;

  KJ_REQUIRE(array.size() >= offset, "Message ends prematurely in segment table.") {
    return;
  }

  {
    uint segmentSize = table[1].get();

    KJ_REQUIRE(array.size() >= offset + segmentSize,
               "Message ends prematurely in first segment.") {
      return;
    }

    segment0 = array.slice(offset, offset + segmentSize);
    offset += segmentSize;
  }

  if (segmentCount > 1) {
    moreSegments = kj::heapArray<kj::ArrayPtr<const word>>(segmentCount - 1);

    for (uint i = 1; i < segmentCount; i++) {
      uint segmentSize = table[i + 1].get();

      KJ_REQUIRE(array.size() >= offset + segmentSize, "Message ends prematurely.") {
        moreSegments = nullptr;
        return;
      }

      moreSegments[i - 1] = array.slice(offset, offset + segmentSize);
      offset += segmentSize;
    }
  }

  end = array.begin() + offset;
}